

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMove5<(moira::Instr)71,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 addr;
  u32 uVar2;
  undefined8 in_RAX;
  u32 data;
  u32 ea;
  undefined8 local_28;
  
  local_28 = in_RAX;
  bVar1 = readOp<(moira::Mode)2,(moira::Size)1,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_28 + 4),(u32 *)&local_28);
  if (bVar1) {
    uVar2 = (u32)local_28;
    (this->reg).sr.n = (bool)((byte)local_28 >> 7);
    (this->reg).sr.z = (byte)local_28 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    addr = computeEA<(moira::Mode)5,(moira::Size)1,0ul>(this,opcode >> 9 & 7);
    writeM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,addr,uVar2);
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    (this->reg).sr.n = (bool)((byte)local_28 >> 7);
    (this->reg).sr.z = (byte)local_28 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
  }
  return;
}

Assistant:

void
Moira::execMove5(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Long && (M == MODE_DN || M == MODE_AN || M == MODE_IM)) {
        reg.sr.n = NBIT<Word>(data >> 16);
        reg.sr.z = ZERO<Word>(data >> 16) && reg.sr.z;
    } else {
        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_DI,S> (dst, data)) return;
    prefetch<POLLIPL>();
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}